

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

int stbtt_PackFontRanges
              (stbtt_pack_context *spc,uchar *fontdata,int font_index,stbtt_pack_range *ranges,
              int num_ranges)

{
  int iVar1;
  stbrp_rect *rects_00;
  stbrp_rect *rects;
  int return_value;
  int n;
  int j;
  int i;
  stbtt_fontinfo info;
  int num_ranges_local;
  stbtt_pack_range *ranges_local;
  int font_index_local;
  uchar *fontdata_local;
  stbtt_pack_context *spc_local;
  
  for (n = 0; n < num_ranges; n = n + 1) {
    for (return_value = 0; return_value < ranges[n].num_chars; return_value = return_value + 1) {
      ranges[n].chardata_for_range[return_value].y1 = 0;
      ranges[n].chardata_for_range[return_value].x1 = 0;
      ranges[n].chardata_for_range[return_value].y0 = 0;
      ranges[n].chardata_for_range[return_value].x0 = 0;
    }
  }
  rects._4_4_ = 0;
  for (n = 0; n < num_ranges; n = n + 1) {
    rects._4_4_ = ranges[n].num_chars + rects._4_4_;
  }
  info.indexToLocFormat = num_ranges;
  rects_00 = (stbrp_rect *)malloc((long)rects._4_4_ * 0x18);
  if (rects_00 == (stbrp_rect *)0x0) {
    spc_local._4_4_ = 0;
  }
  else {
    _j = spc->user_allocator_context;
    iVar1 = stbtt_GetFontOffsetForIndex(fontdata,font_index);
    stbtt_InitFont((stbtt_fontinfo *)&j,fontdata,iVar1);
    iVar1 = stbtt_PackFontRangesGatherRects
                      (spc,(stbtt_fontinfo *)&j,ranges,info.indexToLocFormat,rects_00);
    stbtt_PackFontRangesPackRects(spc,rects_00,iVar1);
    spc_local._4_4_ =
         stbtt_PackFontRangesRenderIntoRects
                   (spc,(stbtt_fontinfo *)&j,ranges,info.indexToLocFormat,rects_00);
    free(rects_00);
  }
  return spc_local._4_4_;
}

Assistant:

STBTT_DEF int stbtt_PackFontRanges(stbtt_pack_context *spc, unsigned char *fontdata, int font_index, stbtt_pack_range *ranges, int num_ranges)
{
   stbtt_fontinfo info;
   int i,j,n, return_value = 1;
   //stbrp_context *context = (stbrp_context *) spc->pack_info;
   stbrp_rect    *rects;

   // flag all characters as NOT packed
   for (i=0; i < num_ranges; ++i)
      for (j=0; j < ranges[i].num_chars; ++j)
         ranges[i].chardata_for_range[j].x0 =
         ranges[i].chardata_for_range[j].y0 =
         ranges[i].chardata_for_range[j].x1 =
         ranges[i].chardata_for_range[j].y1 = 0;

   n = 0;
   for (i=0; i < num_ranges; ++i)
      n += ranges[i].num_chars;
         
   rects = (stbrp_rect *) STBTT_malloc(sizeof(*rects) * n, spc->user_allocator_context);
   if (rects == NULL)
      return 0;

   info.userdata = spc->user_allocator_context;
   stbtt_InitFont(&info, fontdata, stbtt_GetFontOffsetForIndex(fontdata,font_index));

   n = stbtt_PackFontRangesGatherRects(spc, &info, ranges, num_ranges, rects);

   stbtt_PackFontRangesPackRects(spc, rects, n);
  
   return_value = stbtt_PackFontRangesRenderIntoRects(spc, &info, ranges, num_ranges, rects);

   STBTT_free(rects, spc->user_allocator_context);
   return return_value;
}